

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

void __thiscall
polyscope::Histogram::smoothCurve
          (Histogram *this,
          vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *xVals,
          vector<double,_std::allocator<double>_> *yVals)

{
  size_type sVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *in_RSI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double weight;
  double bucketCj;
  size_t j;
  double sum;
  double bucketCi;
  size_t i;
  vector<double,_std::allocator<double>_> smoothedVals;
  anon_class_1_0_00000001 smoothFunc;
  value_type in_stack_ffffffffffffff38;
  allocator_type *in_stack_ffffffffffffff40;
  value_type_conflict2 x1;
  allocator_type *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  size_type local_70;
  value_type local_68;
  ulong local_58;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe0;
  
  geometrycentral::surface::std::vector<double,_std::allocator<double>_>::size(in_RDX);
  std::allocator<double>::allocator((allocator<double> *)0x41a6c3);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::allocator<double>::~allocator((allocator<double> *)0x41a6e9);
  local_58 = 0;
  while( true ) {
    sVar1 = geometrycentral::surface::std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (sVar1 <= local_58) break;
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
              (in_RSI,local_58);
    std::array<double,_2UL>::operator[]
              ((array<double,_2UL> *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38)
    ;
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
              (in_RSI,local_58);
    std::array<double,_2UL>::operator[]
              ((array<double,_2UL> *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38)
    ;
    local_68 = 0.0;
    local_70 = 0;
    while( true ) {
      sVar1 = local_70;
      sVar2 = geometrycentral::surface::std::vector<double,_std::allocator<double>_>::size(in_RDX);
      if (sVar2 <= sVar1) break;
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                (in_RSI,local_70);
      pvVar3 = std::array<double,_2UL>::operator[]
                         ((array<double,_2UL> *)in_stack_ffffffffffffff40,
                          (size_type)in_stack_ffffffffffffff38);
      x1 = *pvVar3;
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                (in_RSI,local_70);
      std::array<double,_2UL>::operator[]
                ((array<double,_2UL> *)in_stack_ffffffffffffff40,
                 (size_type)in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff40 =
           (allocator_type *)
           smoothCurve::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)in_stack_ffffffffffffff50,x1,
                      (double)in_stack_ffffffffffffff40);
      in_stack_ffffffffffffff50 = in_stack_ffffffffffffff40;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)in_RDX,local_70);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = in_stack_ffffffffffffff40;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *pvVar4;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_68;
      auVar5 = vfmadd213sd_fma(auVar5,auVar6,auVar7);
      local_68 = auVar5._0_8_;
      local_70 = local_70 + 1;
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffc8,local_58
                       );
    *pvVar4 = local_68;
    local_58 = local_58 + 1;
    in_stack_ffffffffffffff38 = local_68;
  }
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff50);
  return;
}

Assistant:

void Histogram::smoothCurve(std::vector<std::array<double, 2>>& xVals, std::vector<double>& yVals) {

  auto smoothFunc = [&](double x1, double x2) {
    // Tent
    // double radius = 0.1;
    // double val = (radius - std::abs(x1 - x2)) / radius;
    // return std::max(val, 0.0);

    // Gaussian
    double widthFactor = 1000;
    double dist = (x1 - x2);
    return std::exp(-dist * dist * widthFactor);

    // None
    // if(x1 == x2) return 1.0;
    // return 0.0;
  };

  std::vector<double> smoothedVals(yVals.size());
  for (size_t i = 0; i < yVals.size(); i++) {
    double bucketCi = 0.5 * (xVals[i][0] + xVals[i][1]);
    double sum = 0.0;
    for (size_t j = 0; j < yVals.size(); j++) {
      double bucketCj = 0.5 * (xVals[j][0] + xVals[j][1]);
      double weight = smoothFunc(bucketCi, bucketCj);
      sum += weight * yVals[j];
    }
    smoothedVals[i] = sum;
  }

  yVals = smoothedVals;
}